

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_decoder_settings_init(LodePNGDecoderSettings *settings)

{
  LodePNGDecompressSettings *in_RDI;
  
  *(undefined4 *)&in_RDI[1].field_0x4 = 1;
  *(undefined4 *)&in_RDI[1].custom_zlib = 1;
  *(undefined4 *)((long)&in_RDI[1].custom_zlib + 4) = 0;
  in_RDI[1].ignore_adler32 = 0;
  lodepng_decompress_settings_init(in_RDI);
  return;
}

Assistant:

void lodepng_decoder_settings_init(LodePNGDecoderSettings* settings)
{
  settings->color_convert = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  settings->read_text_chunks = 1;
  settings->remember_unknown_chunks = 0;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  settings->ignore_crc = 0;
  lodepng_decompress_settings_init(&settings->zlibsettings);
}